

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

bool __thiscall MD5::checkDataChecksum(MD5 *this,char *checksum,char *buf,size_t len)

{
  bool bVar1;
  string actual_checksum;
  string local_30;
  
  getDataChecksum_abi_cxx11_(&local_30,(MD5 *)checksum,buf,len);
  bVar1 = std::operator==((char *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
MD5::checkDataChecksum(char const* const checksum, char const* buf, size_t len)
{
    std::string actual_checksum = getDataChecksum(buf, len);
    return (checksum == actual_checksum);
}